

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::setMemorySize
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Name memory,Address size)

{
  bool bVar1;
  mapped_type *pmVar2;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true> local_38;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true> local_30;
  iterator iter;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Address size_local;
  Name memory_local;
  
  size_local.addr = memory.super_IString.str._M_len;
  iter.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true>)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
       ::find(&this->memorySizes,(key_type *)&size_local);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
       ::end(&this->memorySizes);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    (*this->externalInterface->_vptr_ExternalInterface[8])
              (this->externalInterface,"setMemorySize called on non-existing memory");
  }
  pmVar2 = std::
           unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
           ::operator[](&this->memorySizes,(key_type *)&size_local);
  pmVar2->addr = size.addr;
  return;
}

Assistant:

void setMemorySize(Name memory, Address size) {
    auto iter = memorySizes.find(memory);
    if (iter == memorySizes.end()) {
      externalInterface->trap("setMemorySize called on non-existing memory");
    }
    memorySizes[memory] = size;
  }